

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.hpp
# Opt level: O1

void __thiscall
pstore::repo::generic_section::
generic_section<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
          (generic_section *this,
          pair<pstore::pointer_based_iterator<const_unsigned_char>,_pstore::pointer_based_iterator<const_unsigned_char>_>
          *d,pair<__gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>
             *i,pair<__gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>
                *x,uint8_t align)

{
  pointer pvVar1;
  internal_fixup *piVar2;
  external_fixup *peVar3;
  value_type vVar4;
  undefined4 uVar5;
  uint uVar6;
  pointer pvVar7;
  internal_fixup *piVar8;
  external_fixup *peVar9;
  ulong uVar10;
  size_t sVar11;
  uint32_t uVar12;
  uint64_t uVar13;
  long lVar14;
  uint64_t uVar15;
  ulong uVar16;
  undefined3 in_register_00000081;
  internal_fixup *__cur;
  generic_section *pgVar17;
  
  this->field_0 = (anon_union_4_3_9c849b7e_for_generic_section_1)0x0;
  this->num_xfixups_ = 0;
  this->data_size_ = 0;
  uVar6 = bit_count::ctz((ulong)CONCAT31(in_register_00000081,align));
  (this->field_0).field32_ = uVar6 & 0xff;
  if ((byte)(align ^ align - 1) <= (byte)(align - 1)) {
    assert_failed("bit_count::pop_count (align) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/generic_section.hpp"
                  ,0x14a);
  }
  pgVar17 = this + 1;
  pvVar7 = (d->first).pos_;
  pvVar1 = (d->second).pos_;
  if (pvVar7 != pvVar1) {
    uVar13 = (long)pvVar1 - (long)pvVar7;
    uVar15 = 0;
    if (0 < (long)uVar13) {
      uVar15 = uVar13;
    }
    this->data_size_ = uVar15;
    if (0 < (long)uVar13) {
      lVar14 = uVar13 + 1;
      do {
        *(value_type *)&pgVar17->field_0 = *pvVar7;
        pvVar7 = pvVar7 + 1;
        pgVar17 = (generic_section *)
                  ((long)&(pgVar17->field_0).align_.super_bit_field_base<unsigned_int,_0U,_8U,_void>
                          .value_ + 1);
        lVar14 = lVar14 + -1;
      } while (1 < lVar14);
    }
  }
  piVar8 = (i->first)._M_current;
  piVar2 = (i->second)._M_current;
  if (piVar8 != piVar2) {
    pgVar17 = (generic_section *)((ulong)((long)&pgVar17->num_xfixups_ + 3) & 0xfffffffffffffff8);
    do {
      *(int64_t *)((long)pgVar17 + 0x10) = piVar8->addend;
      uVar15 = piVar8->offset;
      *(undefined8 *)pgVar17 = *(undefined8 *)piVar8;
      *(uint64_t *)((long)pgVar17 + 8) = uVar15;
      piVar8 = piVar8 + 1;
      pgVar17 = (generic_section *)((long)pgVar17 + 0x18);
    } while (piVar8 != piVar2);
    lVar14 = (long)(i->second)._M_current - (long)(i->first)._M_current;
    uVar16 = (lVar14 >> 3) * -0x5555555555555555;
    if (0xfffffffe < uVar16) {
      uVar16 = 0xffffffff;
    }
    uVar6 = 0;
    if (0x17 < lVar14) {
      uVar6 = (int)uVar16 << 8;
    }
    (this->field_0).field32_ = uVar6 | *(byte *)&this->field_0;
  }
  peVar9 = (x->first)._M_current;
  peVar3 = (x->second)._M_current;
  if (peVar9 != peVar3) {
    pgVar17 = (generic_section *)((ulong)((long)&pgVar17->num_xfixups_ + 3) & 0xfffffffffffffff8);
    do {
      vVar4 = (peVar9->name).a_.a_;
      uVar15 = *(uint64_t *)&peVar9->type;
      uVar5 = *(undefined4 *)((long)&peVar9->offset + 4);
      uVar13 = peVar9->addend;
      pgVar17[1].field_0 =
           (anon_union_4_3_9c849b7e_for_generic_section_1)*(undefined4 *)&peVar9->offset;
      pgVar17[1].num_xfixups_ = uVar5;
      pgVar17[1].data_size_ = uVar13;
      pgVar17->field_0 = (anon_union_4_3_9c849b7e_for_generic_section_1)(int)vVar4;
      pgVar17->num_xfixups_ = (int)(vVar4 >> 0x20);
      pgVar17->data_size_ = uVar15;
      peVar9 = peVar9 + 1;
      pgVar17 = pgVar17 + 2;
    } while (peVar9 != peVar3);
    uVar10 = (long)(x->second)._M_current - (long)(x->first)._M_current >> 5;
    uVar16 = 0xffffffff;
    if (uVar10 < 0xffffffff) {
      uVar16 = uVar10;
    }
    uVar12 = (uint32_t)uVar16;
    if ((long)uVar10 < 1) {
      uVar12 = 0;
    }
    this->num_xfixups_ = uVar12;
  }
  if (this <= pgVar17) {
    sVar11 = size_bytes<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
                       (d,i,x);
    if ((long)pgVar17 - (long)this == sVar11) {
      return;
    }
  }
  assert_failed("p >= start && static_cast<std::size_t> (p - start) == size_bytes (d, i, x)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/generic_section.hpp"
                ,0x15d);
}

Assistant:

generic_section::generic_section (DataRange const & d, IFixupRange const & i,
                                          XFixupRange const & x, std::uint8_t const align) {
            align_ = bit_count::ctz (align);
            num_ifixups_ = std::uint32_t{0};

            PSTORE_STATIC_ASSERT (std::is_standard_layout<generic_section>::value);

            PSTORE_STATIC_ASSERT (offsetof (generic_section, field32_) == 0);
            PSTORE_STATIC_ASSERT (offsetof (generic_section, align_) ==
                                  offsetof (generic_section, field32_));
            PSTORE_STATIC_ASSERT (offsetof (generic_section, num_ifixups_) ==
                                  offsetof (generic_section, field32_));

            PSTORE_STATIC_ASSERT (offsetof (generic_section, num_xfixups_) == 4);
            PSTORE_STATIC_ASSERT (offsetof (generic_section, data_size_) == 8);
            PSTORE_STATIC_ASSERT (sizeof (generic_section) == 16);
            PSTORE_STATIC_ASSERT (alignof (generic_section) == 8);
#ifndef NDEBUG
            auto * const start = reinterpret_cast<std::uint8_t const *> (this);
#endif
            // Note that the memory pointed to by 'p' is uninitialized.
            auto * p = reinterpret_cast<std::uint8_t *> (this + 1);
            PSTORE_ASSERT (bit_count::pop_count (align) == 1);

            if (d.first != d.second) {
                data_size_ = generic_section::set_size<decltype (data_size_)> (d.first, d.second);
                p = std::uninitialized_copy (d.first, d.second, p);
            }
            if (i.first != i.second) {
                p = reinterpret_cast<std::uint8_t *> (
                    std::uninitialized_copy (i.first, i.second, aligned_ptr<internal_fixup> (p)));
                num_ifixups_ = generic_section::set_size<decltype (num_ifixups_)::value_type> (
                    i.first, i.second);
            }
            if (x.first != x.second) {
                p = reinterpret_cast<std::uint8_t *> (
                    std::uninitialized_copy (x.first, x.second, aligned_ptr<external_fixup> (p)));
                num_xfixups_ =
                    generic_section::set_size<decltype (num_xfixups_)> (x.first, x.second);
            }
            PSTORE_ASSERT (p >= start &&
                           static_cast<std::size_t> (p - start) == size_bytes (d, i, x));
        }